

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Computations.h
# Opt level: O3

void BoxTranslate(box *Src,box *Dest,interval *distance,interval *angle,int dir)

{
  interval *piVar1;
  box P;
  interval yvect;
  interval xvect;
  interval local_80;
  box local_68;
  interval local_58;
  interval local_40;
  
  box::box(&local_68,2);
  Cos(&local_58,angle);
  operator*(distance,&local_58);
  Sin(&local_80,angle);
  operator*(distance,&local_80);
  if (dir == 1) {
    piVar1 = box::operator[](Src,1);
    operator+(piVar1,&local_40);
    piVar1 = box::operator[](&local_68,1);
    interval::operator=(piVar1,&local_80);
    piVar1 = box::operator[](Src,2);
    operator+(piVar1,&local_58);
    piVar1 = box::operator[](&local_68,2);
    interval::operator=(piVar1,&local_80);
    Inter((box *)&local_80,Dest);
    box::operator=(Dest,(box *)&local_80);
  }
  else {
    piVar1 = box::operator[](Dest,1);
    operator-(piVar1,&local_40);
    piVar1 = box::operator[](&local_68,1);
    interval::operator=(piVar1,&local_80);
    piVar1 = box::operator[](Dest,2);
    operator-(piVar1,&local_58);
    piVar1 = box::operator[](&local_68,2);
    interval::operator=(piVar1,&local_80);
    Inter((box *)&local_80,Src);
    box::operator=(Src,(box *)&local_80);
  }
  box::~box((box *)&local_80);
  box::~box(&local_68);
  return;
}

Assistant:

inline void BoxTranslate(box &Src, box &Dest, interval distance, interval angle, int dir)
{
	box P = box(2);
	interval xvect = distance*Cos(angle);
	interval yvect = distance*Sin(angle);

	if (dir == 1) 
	{
		P[1] = Src[1]+xvect;
		P[2] = Src[2]+yvect;
		Dest = Inter(Dest,P);
	}
	else
	{
		P[1] = Dest[1]-xvect;
		P[2] = Dest[2]-yvect;
		Src = Inter(Src,P);
	}
}